

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_entry.hpp
# Opt level: O0

void __thiscall
asio::ip::basic_resolver_entry<asio::ip::udp>::basic_resolver_entry
          (basic_resolver_entry<asio::ip::udp> *this,endpoint_type *ep,string_view host,
          string_view service)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff88;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff90;
  allocator<char> local_45 [5];
  allocator<char> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc8;
  
  basic_endpoint<asio::ip::udp>::basic_endpoint(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::allocator<char>::~allocator(local_45);
  return;
}

Assistant:

basic_resolver_entry(const endpoint_type& ep,
      ASIO_STRING_VIEW_PARAM host, ASIO_STRING_VIEW_PARAM service)
    : endpoint_(ep),
      host_name_(static_cast<std::string>(host)),
      service_name_(static_cast<std::string>(service))
  {
  }